

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O1

void __thiscall
SimpleBVH::BVH::box_search_recursive
          (BVH *this,VectorMax3d *bbd0,VectorMax3d *bbd1,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *list,int n,int b,int e)

{
  iterator __position;
  bool bVar1;
  int e_00;
  uint local_34 [2];
  int b_local;
  
  local_34[0] = b;
  if (e == b) {
    __assert_fail("e != b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xdc,
                  "void SimpleBVH::BVH::box_search_recursive(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &, int, int, int) const"
                 );
  }
  if ((ulong)(long)n <
      (ulong)((long)(this->boxlist).
                    super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->boxlist).
                    super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6)) {
    bVar1 = box_intersects_box(this,bbd0,bbd1,n);
    if (bVar1) {
      if (local_34[0] + 1 == e) {
        __position._M_current =
             (list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<int&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)list,__position,
                     (int *)local_34);
        }
        else {
          *__position._M_current = local_34[0];
          (list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      else {
        e_00 = (int)(e - local_34[0]) / 2 + local_34[0];
        box_search_recursive(this,bbd0,bbd1,list,n * 2,local_34[0],e_00);
        box_search_recursive(this,bbd0,bbd1,list,n * 2 + 1,e_00,e);
      }
    }
    return;
  }
  __assert_fail("n < boxlist.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                ,0xde,
                "void SimpleBVH::BVH::box_search_recursive(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &, int, int, int) const"
               );
}

Assistant:

void BVH::box_search_recursive(
    const VectorMax3d& bbd0,
    const VectorMax3d& bbd1,
    std::vector<unsigned int>& list,
    int n,
    int b,
    int e) const
{
    assert(e != b);

    assert(n < boxlist.size());
    bool cut = box_intersects_box(bbd0, bbd1, n);

    if (cut == false)
        return;

    // Leaf case
    if (e == b + 1) {
        list.emplace_back(b);
        return;
    }

    int m = b + (e - b) / 2;
    int childl = 2 * n;
    int childr = 2 * n + 1;

    // assert(childl < boxlist.size());
    // assert(childr < boxlist.size());

    // Traverse the "nearest" child first, so that it has more chances
    // to prune the traversal of the other child.
    box_search_recursive(bbd0, bbd1, list, childl, b, m);
    box_search_recursive(bbd0, bbd1, list, childr, m, e);
}